

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O2

void RigidBodyDynamics::CalcConstraintsJacobian
               (Model *model,VectorNd *Q,ConstraintSet *CS,MatrixNd *G,bool update_kinematics)

{
  long *plVar1;
  uint uVar2;
  undefined7 in_register_00000081;
  
  if ((int)CONCAT71(in_register_00000081,update_kinematics) != 0) {
    UpdateKinematicsCustom(model,Q,(VectorNd *)0x0,(VectorNd *)0x0);
  }
  uVar2 = 0;
  while( true ) {
    if ((ulong)(*(long *)(CS + 0xd0) - *(long *)(CS + 200) >> 4) <= (ulong)uVar2) break;
    plVar1 = *(long **)(*(long *)(CS + 200) + (ulong)uVar2 * 0x10);
    (**(code **)(*plVar1 + 8))(0,plVar1,model,Q,CS + 0x620,G,CS + 0x620,update_kinematics);
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

RBDL_DLLAPI
void CalcConstraintsJacobian (
  Model &model,
  const Math::VectorNd &Q,
  ConstraintSet &CS,
  Math::MatrixNd &G,
  bool update_kinematics
)
{
  if (update_kinematics) {
    UpdateKinematicsCustom (model, &Q, NULL, NULL);
  }

  for(unsigned int i=0; i<CS.constraints.size(); ++i) {
    CS.constraints[i]->calcConstraintJacobian(model,0,Q,CS.cache.vecNZeros,G,
        CS.cache,update_kinematics);
  }
}